

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O2

Amount cfd::core::operator+(int64_t satoshi_amount,Amount *amount)

{
  Amount AVar1;
  Amount local_18;
  
  AVar1 = Amount::CreateBySatoshiAmount(amount->amount_);
  local_18.amount_ = AVar1.amount_;
  local_18.ignore_check_ = AVar1.ignore_check_;
  AVar1 = Amount::operator+=(&local_18,satoshi_amount);
  return AVar1;
}

Assistant:

Amount operator+(const int64_t satoshi_amount, const Amount& amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) +=
         satoshi_amount;
}